

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletload_tests.cpp
# Opt level: O3

bool wallet::walletload_tests::HasAnyRecordOfType(WalletDatabase *db,string *key)

{
  int iVar1;
  bool bVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  string type;
  check_type cVar5;
  pointer local_118;
  element_type *peStack_110;
  shared_count sStack_108;
  undefined8 uStack_100;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  long *local_c0;
  char *local_b8;
  char *local_b0;
  DataStream local_a8;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  long *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (*db->_vptr_WalletDatabase[0xe])(&local_60,db,0);
  local_70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x59;
  file.m_begin = (iterator)&local_70;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_80,msg);
  peStack_110 = (element_type *)0x0;
  sStack_108.pi_ = (sp_counted_base *)0x0;
  local_58._M_dataplus._M_p = "batch";
  local_58._M_string_length = 0xe5d340;
  local_a8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_a8.vch.
                        super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
                        .super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_a8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389048;
  local_a8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
  ;
  local_b0 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_a8.m_read_pos = (size_type)&local_58;
  local_118._0_1_ = (class_property<bool>)(class_property<bool>)(local_60 != (long *)0x0);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_118,(lazy_ostream *)&local_a8,1,0,WARN,_cVar5,
             (size_t)&local_b8,0x59);
  boost::detail::shared_count::~shared_count(&sStack_108);
  (**(code **)(*local_60 + 0x48))(&local_c0);
  local_d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x5b;
  file_00.m_begin = (iterator)&local_d0;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_e0,msg_00
            );
  local_118 = (pointer)CONCAT71(local_118._1_7_,local_c0 != (long *)0x0);
  peStack_110 = (element_type *)0x0;
  sStack_108.pi_ = (sp_counted_base *)0x0;
  local_58._M_dataplus._M_p = "cursor";
  local_58._M_string_length = 0xf785f2;
  local_a8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_a8.vch.
                        super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
                        .super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_a8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389048;
  local_a8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
  ;
  local_e8 = "";
  local_a8.m_read_pos = (size_type)&local_58;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_118,(lazy_ostream *)&local_a8,1,0,WARN,_cVar5,
             (size_t)&local_f0,0x5b);
  boost::detail::shared_count::~shared_count(&sStack_108);
  do {
    local_a8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8.m_read_pos = 0;
    local_a8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    sStack_108.pi_ = (sp_counted_base *)0x0;
    uStack_100 = 0;
    local_118 = (pointer)0x0;
    peStack_110 = (element_type *)0x0;
    iVar1 = (**(code **)(*local_c0 + 0x10))
                      (local_c0,&local_a8,
                       (_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_118)
    ;
    if (iVar1 == 2) {
      std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_118);
      std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_a8);
      bVar2 = false;
      goto LAB_0081c957;
    }
    if (iVar1 == 0) {
      __assert_fail("status != DatabaseCursor::Status::FAIL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
                    ,0x60,
                    "bool wallet::walletload_tests::HasAnyRecordOfType(WalletDatabase &, const std::string &)"
                   );
    }
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    Unserialize<DataStream,char>(&local_a8,&local_58);
    bVar2 = true;
    if ((char *)local_58._M_string_length == (char *)key->_M_string_length) {
      if ((char *)local_58._M_string_length != (char *)0x0) {
        iVar1 = bcmp(local_58._M_dataplus._M_p,(key->_M_dataplus)._M_p,local_58._M_string_length);
        if (iVar1 != 0) goto LAB_0081c904;
      }
      bVar2 = false;
    }
LAB_0081c904:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
    std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
              ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_118);
    std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
              ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_a8);
  } while (bVar2);
  bVar2 = true;
LAB_0081c957:
  if (local_c0 != (long *)0x0) {
    (**(code **)(*local_c0 + 8))();
  }
  if (local_60 != (long *)0x0) {
    (**(code **)(*local_60 + 0x28))();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool HasAnyRecordOfType(WalletDatabase& db, const std::string& key)
{
    std::unique_ptr<DatabaseBatch> batch = db.MakeBatch(false);
    BOOST_CHECK(batch);
    std::unique_ptr<DatabaseCursor> cursor = batch->GetNewCursor();
    BOOST_CHECK(cursor);
    while (true) {
        DataStream ssKey{};
        DataStream ssValue{};
        DatabaseCursor::Status status = cursor->Next(ssKey, ssValue);
        assert(status != DatabaseCursor::Status::FAIL);
        if (status == DatabaseCursor::Status::DONE) break;
        std::string type;
        ssKey >> type;
        if (type == key) return true;
    }
    return false;
}